

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CovergroupBodySymbol::serializeTo(CovergroupBodySymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *this_00;
  bool bVar1;
  iterator pCVar2;
  CoverageOptionSetter *opt;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range3;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  CovergroupBodySymbol *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  bVar1 = nonstd::span_lite::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::
          empty(&this->options);
  this_00 = local_18;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"options");
    ASTSerializer::startArray(this_00,___range3);
    __end3 = nonstd::span_lite::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>
             ::begin(&this->options);
    pCVar2 = nonstd::span_lite::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>
             ::end(&this->options);
    for (; __end3 != pCVar2; __end3 = __end3 + 1) {
      CoverageOptionSetter::serializeTo(__end3,local_18);
    }
    ASTSerializer::endArray(local_18);
  }
  return;
}

Assistant:

void CovergroupBodySymbol::serializeTo(ASTSerializer& serializer) const {
    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options)
            opt.serializeTo(serializer);
        serializer.endArray();
    }
}